

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive_threshold.hpp
# Opt level: O3

void re::math::threshold_reference<float,512l,512l,512l>
               (span<const_float,_512L> in,span<float,_512L> out,span<float,_512L> thresh,
               int_t radius)

{
  math *pmVar1;
  long lVar2;
  math *pmVar3;
  long lVar4;
  math *this;
  float fVar5;
  span<const_float,__1L> input;
  storage_type<gsl::details::extent_type<512L>_> local_98;
  storage_type<gsl::details::extent_type<512L>_> local_90;
  storage_type<gsl::details::extent_type<512L>_> local_88;
  undefined1 local_80 [16];
  storage_type<gsl::details::extent_type<512L>_> *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  undefined8 local_58;
  storage_type<gsl::details::extent_type<512L>_> *local_50;
  undefined8 local_48;
  storage_type<gsl::details::extent_type<512L>_> *local_40;
  undefined8 local_38;
  
  lVar4 = 0;
  local_98 = thresh.storage_.data_;
  local_90 = out.storage_.data_;
  local_88 = in.storage_.data_;
  do {
    lVar2 = lVar4 - radius;
    if (lVar2 < 1) {
      lVar2 = 0;
    }
    pmVar3 = (math *)(0x200 - lVar2);
    this = pmVar3;
    if ((long)(radius * 2) < (long)pmVar3) {
      this = (math *)(radius * 2);
    }
    pmVar1 = (math *)(radius + lVar4);
    if ((long)pmVar1 < (long)this) {
      this = pmVar1;
    }
    if (this == (math *)0xffffffffffffffff) {
      this = pmVar3;
    }
    input.storage_.data_ = (pointer)pmVar1;
    input.storage_.super_extent_type<_1L>.size_ = (long)in.storage_.data_ + lVar2 * 4;
    fVar5 = mean<float,_1l>(this,input);
    *(float *)((long)thresh.storage_.data_ + lVar4 * 4) = fVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x200);
  local_50 = &local_88;
  local_38 = 0;
  local_48 = 0x200;
  local_58 = 0;
  local_70 = &local_90;
  local_68 = 0;
  local_60 = (undefined1 *)&local_98;
  local_40 = local_50;
  ::std::
  transform<gsl::details::span_iterator<gsl::span<float_const,512l>,false>,gsl::details::span_iterator<gsl::span<float,512l>,false>,gsl::details::span_iterator<gsl::span<float,512l>,false>,re::math::threshold_reference<float,512l,512l,512l>(gsl::span<float_const,512l>,gsl::span<float,512l>,gsl::span<float,512l>,long)::_lambda(auto:1,auto:2)_1_>
            (local_80);
  return;
}

Assistant:

void threshold_reference(
    gsl::span<T const, N_in> in,
    gsl::span<T, N_out> out,
    gsl::span<T, N_thresh> thresh,
    int_t radius
) noexcept {
    assert(
        std::size(in) == std::size(out)
        && std::size(out) == std::size(thresh)
    );
    auto const n = std::size(in);

    for (int_t i = 0; i < n; ++i) {
        auto offset = std::max(i - radius, int_t{0});
        auto count = std::min(n - offset, 2*radius);
        count = std::min(count, i + radius);
        thresh[i] = mean(in.subspan(offset, count));
    }

    std::transform(
        std::cbegin(in),
        std::cend(in),
        std::cbegin(thresh),
        std::begin(out),
        [] (auto value, auto threshold) {
            return std::fdim(value, threshold);
        }
    );
}